

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipsDisassembler.c
# Opt level: O0

DecodeStatus DecodeINSVE_DF_4(MCInst *MI,uint32_t insn,uint64_t Address,MCRegisterInfo *Decoder)

{
  uint32_t uVar1;
  int iVar2;
  undefined8 in_RCX;
  undefined8 in_RDX;
  uint32_t in_ESI;
  MCInst *in_RDI;
  bool bVar3;
  DecodeFN RegDecoder;
  uint NSize;
  uint32_t tmp;
  code *local_38;
  uint local_30;
  DecodeStatus local_4;
  
  uVar1 = fieldFromInstruction(in_ESI,0x11,5);
  local_38 = (code *)0x0;
  if ((uVar1 & 0x18) == 0) {
    local_30 = 4;
    local_38 = DecodeMSA128BRegisterClass;
  }
  else if ((uVar1 & 0x1c) == 0x10) {
    local_30 = 3;
    local_38 = DecodeMSA128HRegisterClass;
  }
  else if ((uVar1 & 0x1e) == 0x18) {
    local_30 = 2;
    local_38 = DecodeMSA128WRegisterClass;
  }
  else {
    bVar3 = (uVar1 & 0x1f) == 0x1c;
    if (bVar3) {
      local_38 = DecodeMSA128DRegisterClass;
    }
    local_30 = (uint)bVar3;
  }
  if ((local_30 == 0) || (local_38 == (code *)0x0)) {
    local_4 = MCDisassembler_Fail;
  }
  else {
    uVar1 = fieldFromInstruction(in_ESI,6,5);
    iVar2 = (*local_38)(in_RDI,uVar1,in_RDX,in_RCX);
    if (iVar2 == 0) {
      local_4 = MCDisassembler_Fail;
    }
    else {
      iVar2 = (*local_38)(in_RDI,uVar1,in_RDX,in_RCX);
      if (iVar2 == 0) {
        local_4 = MCDisassembler_Fail;
      }
      else {
        uVar1 = fieldFromInstruction(in_ESI,0x10,local_30);
        MCOperand_CreateImm0(in_RDI,(ulong)uVar1);
        uVar1 = fieldFromInstruction(in_ESI,0xb,5);
        iVar2 = (*local_38)(in_RDI,uVar1,in_RDX,in_RCX);
        if (iVar2 == 0) {
          local_4 = MCDisassembler_Fail;
        }
        else {
          MCOperand_CreateImm0(in_RDI,0);
          local_4 = MCDisassembler_Success;
        }
      }
    }
  }
  return local_4;
}

Assistant:

static DecodeStatus DecodeINSVE_DF_4(MCInst *MI, uint32_t insn,
		uint64_t Address, const MCRegisterInfo *Decoder)
{
	typedef DecodeStatus (*DecodeFN)(MCInst *, unsigned, uint64_t, const MCRegisterInfo *);
	// The size of the n field depends on the element size
	// The register class also depends on this.
	uint32_t tmp = fieldFromInstruction(insn, 17, 5);
	unsigned NSize = 0;
	DecodeFN RegDecoder = NULL;

	if ((tmp & 0x18) == 0x00) { // INSVE_B
		NSize = 4;
		RegDecoder = DecodeMSA128BRegisterClass;
	} else if ((tmp & 0x1c) == 0x10) { // INSVE_H
		NSize = 3;
		RegDecoder = DecodeMSA128HRegisterClass;
	} else if ((tmp & 0x1e) == 0x18) { // INSVE_W
		NSize = 2;
		RegDecoder = DecodeMSA128WRegisterClass;
	} else if ((tmp & 0x1f) == 0x1c) { // INSVE_D
		NSize = 1;
		RegDecoder = DecodeMSA128DRegisterClass;
	} //else llvm_unreachable("Invalid encoding");

	//assert(NSize != 0 && RegDecoder != nullptr);
	if (NSize == 0 || RegDecoder == NULL)
		return MCDisassembler_Fail;

	// $wd
	tmp = fieldFromInstruction(insn, 6, 5);
	if (RegDecoder(MI, tmp, Address, Decoder) == MCDisassembler_Fail)
		return MCDisassembler_Fail;

	// $wd_in
	if (RegDecoder(MI, tmp, Address, Decoder) == MCDisassembler_Fail)
		return MCDisassembler_Fail;

	// $n
	tmp = fieldFromInstruction(insn, 16, NSize);
	MCOperand_CreateImm0(MI, tmp);

	// $ws
	tmp = fieldFromInstruction(insn, 11, 5);
	if (RegDecoder(MI, tmp, Address, Decoder) == MCDisassembler_Fail)
		return MCDisassembler_Fail;

	// $n2
	MCOperand_CreateImm0(MI, 0);

	return MCDisassembler_Success;
}